

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O2

void __thiscall KeyData_FromStringExtPubkey_Test::TestBody(KeyData_FromStringExtPubkey_Test *this)

{
  bool bVar1;
  size_t idx;
  ulong uVar2;
  char *pcVar3;
  char *in_R9;
  long lVar4;
  initializer_list<unsigned_int> __l;
  AssertionResult gtest_ar_2;
  AssertHelper local_348;
  AssertionResult gtest_ar_;
  vector<unsigned_int,_std::allocator<unsigned_int>_> array1;
  AssertionResult gtest_ar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> obj_arr;
  string key1;
  KeyData obj1;
  
  std::__cxx11::string::string
            ((string *)&key1,
             "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,(allocator *)&obj1);
  obj1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x280000001;
  obj1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish._0_4_ = 0x80000003;
  __l._M_len = 3;
  __l._M_array = (iterator)&obj1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&array1,__l,(allocator_type *)&gtest_ar);
  cfd::core::KeyData::KeyData(&obj1);
  cfd::core::KeyData::KeyData((KeyData *)&gtest_ar,&key1,-1,false);
  cfd::core::KeyData::operator=(&obj1,(KeyData *)&gtest_ar);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar);
  cfd::core::KeyData::GetChildNumArray(&obj_arr,&obj1);
  bVar1 = cfd::core::KeyData::IsValid(&obj1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x45f918,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x13e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::KeyData::HasPrivkey(&obj1);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"obj.HasPrivkey()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x13f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = cfd::core::KeyData::HasExtPubkey(&obj1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"obj.HasExtPubkey()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x140,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::KeyData::HasExtPrivkey(&obj1);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"obj.HasExtPrivkey()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x141,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ =
       (long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  gtest_ar_2._0_8_ =
       (long)obj_arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)obj_arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"arr_obj.size()","obj_arr.size()",(unsigned_long *)&gtest_ar_,
             (unsigned_long *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x142,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::KeyData::GetBip32Path_abi_cxx11_((string *)&gtest_ar,&obj1,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,"\"1\'/2/3\'\"","obj.GetBip32Path().c_str()","1\'/2/3\'",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x143,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::KeyData::GetFingerprint((ByteData *)&gtest_ar_,&obj1);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)&gtest_ar_);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"\"3456789a\"","obj.GetFingerprint().GetHex().c_str()",
             "3456789a",(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x144,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::KeyData::GetExtPubkey((ExtPubkey *)&gtest_ar,&obj1);
  cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)&gtest_ar_,(ExtPubkey *)&gtest_ar);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "\"tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua\""
             ,"obj.GetExtPubkey().ToString().c_str()",
             "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,(char *)gtest_ar_._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x147,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::KeyData::GetPubkey((Pubkey *)&gtest_ar_,&obj1);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&gtest_ar,(Pubkey *)&gtest_ar_);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "\"03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\"",
             "obj.GetPubkey().GetHex().c_str()",
             "03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x14a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  lVar4 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"arr_obj[idx]","obj_arr[idx]",
               (uint *)((long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar4),
               (uint *)((long)obj_arr.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar4));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
                 ,0x14c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar4 = lVar4 + 4;
  }
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&gtest_ar,&obj1,true,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,
             "\"[3456789a/1\'/2/3\']03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\""
             ,"obj.ToString().c_str()",
             "[3456789a/1\'/2/3\']03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3"
             ,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x150,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::KeyData::GetBip32Path_abi_cxx11_((string *)&gtest_ar,&obj1,kNumber,true);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,"\"0x80000001/0x2/0x80000003\"",
             "obj.GetBip32Path(HardenedType::kNumber, true).c_str()","0x80000001/0x2/0x80000003",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x152,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&gtest_ar,&obj1,false,kSmallH,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,
             "\"[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua\""
             ,"obj.ToString(false, HardenedType::kSmallH).c_str()",
             "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_keydata.cpp"
               ,0x156,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&obj_arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  cfd::core::KeyData::~KeyData(&obj1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::string::~string((string *)&key1);
  return;
}

Assistant:

TEST(KeyData, FromStringExtPubkey) {
  std::string key1 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua";
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_TRUE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua",
        obj.GetExtPubkey().ToString().c_str());
    EXPECT_STREQ(
        "03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3']03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1;
  try {
    obj1 = KeyData(key1);
    check_func(obj1, array1);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }
}